

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisnsf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 __nptr;
  uint uVar2;
  int iVar3;
  off_t i;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  mapped_type *pmVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  char *__format;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  char *endptr;
  string bytestr;
  uint8_t exe [264];
  string hexstring;
  char libname [4096];
  ulong local_21f0;
  ulong local_21e0;
  char *local_21d8;
  char *local_21d0;
  int local_21c4;
  ulong local_21c0;
  long local_21b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21b0;
  char *local_2180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2178;
  uint8_t local_2148;
  undefined1 local_2147;
  undefined1 local_2146;
  undefined1 local_2145;
  undefined1 local_2144;
  undefined1 local_2143;
  undefined1 local_2142;
  undefined1 local_2141;
  undefined1 auStack_2140 [264];
  key_type local_2038 [128];
  char local_1038 [4104];
  
  if (argc == 1) {
LAB_00104713:
    usage(*argv);
  }
  else {
    local_21d0 = (char *)0x0;
    uVar10 = 1;
    if ((argc < 2) || (pcVar12 = argv[1], *pcVar12 != '-')) {
      local_21d8 = (char *)0x0;
    }
    else {
      lVar6 = 2;
      uVar2 = 3;
      do {
        uVar10 = uVar2;
        lVar9 = lVar6;
        iVar3 = strcmp(pcVar12,"--help");
        if (iVar3 == 0) goto LAB_00104713;
        iVar3 = strcmp(pcVar12,"--psfby");
        if ((iVar3 != 0) && (iVar3 = strcmp(pcVar12,"--snsfby"), iVar3 != 0)) {
          __format = "Error: Unknown option \"%s\"\n";
LAB_00104e24:
          fprintf(_stderr,__format,pcVar12);
          return 1;
        }
        if (argc <= (int)lVar9) {
          __format = "Error: Too few arguments for \"%s\"\n";
          goto LAB_00104e24;
        }
        if (argc <= (int)uVar10) break;
        pcVar12 = argv[lVar9 + 1];
        lVar6 = lVar9 + 2;
        uVar2 = uVar10 + 2;
      } while (*pcVar12 == '-');
      local_21d8 = argv[lVar9];
    }
    if (argc - uVar10 == 4) {
      local_2180 = argv[uVar10];
      sprintf(local_1038,"%s.snsflib");
      local_21c0 = strtol(argv[(ulong)uVar10 + 1],&local_21d0,0x10);
      if (((*local_21d0 == '\0') && (piVar4 = __errno_location(), *piVar4 != 0x22)) &&
         (-1 < (long)local_21c0)) {
        local_21b8 = strtol(argv[(ulong)uVar10 + 3],&local_21d0,10);
        if (((*local_21d0 == '\0') && (*piVar4 != 0x22)) && (-1 < local_21b8)) {
          memset(&local_2148,0,0x108);
          pcVar12 = argv[(ulong)uVar10 + 2];
          if (*pcVar12 == '=') {
            local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
            sVar5 = strlen(pcVar12 + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2038,pcVar12 + 1,pcVar12 + sVar5 + 1);
            if ((local_2038[0]._M_string_length & 1) == 0) {
              local_21e0 = local_2038[0]._M_string_length >> 1;
              if (local_2038[0]._M_string_length < 0x202) {
                bVar14 = local_2038[0]._M_string_length == 0;
                if (bVar14) {
                  local_21f0 = 0;
                  uVar11 = 0;
                  uVar10 = 0;
                }
                else {
                  uVar13 = 0;
                  uVar10 = 0;
                  bVar14 = false;
                  uVar11 = 0;
                  local_21f0 = 0;
                  do {
                    std::__cxx11::string::substr((ulong)&local_21b0,(ulong)local_2038);
                    __nptr = local_21b0._M_impl._0_8_;
                    iVar3 = strcasecmp((char *)local_21b0._M_impl._0_8_,"NN");
                    if (iVar3 == 0) {
                      if (uVar11 == 0) {
                        bVar1 = true;
                        uVar11 = 1;
                        bVar14 = true;
                        local_21f0 = uVar13;
                      }
                      else if (bVar14) {
                        uVar11 = uVar11 + 1;
                        bVar1 = true;
                      }
                      else {
                        main_cold_5();
                        uVar10 = 1;
                        bVar1 = false;
                      }
                    }
                    else {
                      lVar6 = strtol((char *)__nptr,&local_21d0,0x10);
                      if ((*local_21d0 == '\0') && (*piVar4 != 0x22)) {
                        auStack_2140[uVar13] = (char)lVar6;
                        bVar1 = true;
                      }
                      else {
                        main_cold_4();
                        uVar10 = 1;
                        bVar1 = false;
                      }
                      bVar14 = false;
                    }
                    if ((_Base_ptr *)local_21b0._M_impl._0_8_ !=
                        &local_21b0._M_impl.super__Rb_tree_header._M_header._M_parent) {
                      operator_delete((void *)local_21b0._M_impl._0_8_,
                                      (ulong)((long)&(local_21b0._M_impl.super__Rb_tree_header.
                                                      _M_header._M_parent)->_M_color + 1));
                    }
                    if (!bVar1) {
                      bVar14 = false;
                      goto LAB_00104a88;
                    }
                    uVar13 = uVar13 + 1;
                  } while (local_21e0 != uVar13);
                  bVar14 = true;
                }
              }
              else {
                main_cold_6();
                uVar10 = 1;
                bVar14 = false;
                local_21f0 = 0;
                uVar11 = 0;
              }
            }
            else {
              main_cold_3();
              uVar10 = 1;
              bVar14 = false;
              local_21f0 = 0;
              uVar11 = 0;
              local_21e0 = 0;
            }
LAB_00104a88:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
              operator_delete(local_2038[0]._M_dataplus._M_p,
                              local_2038[0].field_2._M_allocated_capacity + 1);
            }
            iVar3 = (int)local_21e0;
            if (!bVar14) {
              return uVar10;
            }
          }
          else {
            uVar11 = strtol(pcVar12,&local_21d0,10);
            if (((*local_21d0 != '\0') || (*piVar4 == 0x22)) || ((long)uVar11 < 0)) {
              main_cold_2();
              return 1;
            }
            local_21f0 = 0;
            iVar3 = (int)uVar11;
          }
          if (uVar11 < 5) {
            local_2148 = (uint8_t)local_21c0;
            local_2147 = (undefined1)(local_21c0 >> 8);
            local_2146 = (undefined1)(local_21c0 >> 0x10);
            local_2145 = (undefined1)(local_21c0 >> 0x18);
            local_2144 = (undefined1)iVar3;
            local_2143 = (undefined1)((uint)iVar3 >> 8);
            local_2142 = (undefined1)((uint)iVar3 >> 0x10);
            local_2141 = (undefined1)((uint)iVar3 >> 0x18);
            if ((uint)local_21b8 == 0) {
              return 0;
            }
            uVar10 = 0;
            local_21c4 = 0;
            local_21c0 = uVar11;
            do {
              local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
              local_21b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_21b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_21b0._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)((long)&local_21b0 + 8);
              local_21b0._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_21b0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_21b0._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"_lib","");
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_21b0,local_2038);
              pcVar12 = (char *)pmVar7->_M_string_length;
              strlen(local_1038);
              std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar12,(ulong)local_1038);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
                operator_delete(local_2038[0]._M_dataplus._M_p,
                                local_2038[0].field_2._M_allocated_capacity + 1);
              }
              if ((local_21d8 != (char *)0x0) && (*local_21d8 != '\0')) {
                local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"snsfby","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_21b0,local_2038);
                pcVar12 = (char *)pmVar7->_M_string_length;
                strlen(local_21d8);
                std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar12,(ulong)local_21d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
                  operator_delete(local_2038[0]._M_dataplus._M_p,
                                  local_2038[0].field_2._M_allocated_capacity + 1);
                }
              }
              sprintf((char *)local_2038,"%s-%04d.minisnsf",local_2180);
              if (uVar11 != 0 && -1 < (long)local_21f0) {
                bVar8 = 0;
                uVar13 = 0;
                do {
                  auStack_2140[uVar13 + local_21f0] = (char)(uVar10 >> (bVar8 & 0x1f));
                  uVar13 = uVar13 + 1;
                  bVar8 = bVar8 + 8;
                } while (local_21c0 != uVar13);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::_Rb_tree(&local_2178,&local_21b0);
              bVar14 = exe2snsf((char *)local_2038,&local_2148,iVar3 + 8,
                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_2178);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_2178);
              if (bVar14) {
                printf("Created %s\n",local_2038);
              }
              else {
                printf("Error: Unable to create %s\n",local_2038);
                local_21c4 = local_21c4 + 1;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_21b0);
              uVar10 = uVar10 + 1;
            } while (uVar10 != (uint)local_21b8);
            return (uint)(local_21c4 != 0);
          }
          main_cold_7();
        }
        else {
          main_cold_8();
        }
      }
      else {
        main_cold_9();
      }
    }
    else {
      main_cold_1();
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum != 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * snsf_basename = argv[argi];

	char libname[PATH_MAX];
	sprintf(libname, "%s.snsflib", snsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;

	longval = strtol(argv[argi + 3], &endptr, 10);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
		return EXIT_FAILURE;
	}
	uint32_t count = (uint32_t)longval;

	uint8_t exe[SNSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, SNSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[SNSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	writeInt(&exe[0], load_offset);
	writeInt(&exe[4], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		char snsf_path[PATH_MAX];
		sprintf(snsf_path, "%s-%04d.minisnsf", snsf_basename, num);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[SNSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2snsf(snsf_path, exe, SNSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", snsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", snsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}